

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O3

char * google::protobuf::internal::TcParser::FastGdS2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  ushort uVar1;
  uint32_t uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TcParseTableBase *pTVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  char *pcVar9;
  ushort *puVar10;
  Nonnull<const_char_*> failure_msg;
  int iVar11;
  ushort *puVar12;
  Arena *arena;
  uint *puVar13;
  long *plVar14;
  TcParseTableBase *unaff_R13;
  ushort *local_58 [2];
  ulong local_48;
  MessageLite *msg_00;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  uVar1 = *(ushort *)ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar14 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar14 & 7) != 0) {
    AlignFail(plVar14);
  }
  pTVar6 = MessageLite::GetTcParseTable
                     (*(MessageLite **)
                       ((long)&table->has_bits_offset +
                       ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset));
  pMVar7 = (MessageLite *)*plVar14;
  if (pMVar7 == (MessageLite *)0x0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar7 = ClassData::New(pTVar6->class_data,arena);
    *plVar14 = (long)pMVar7;
  }
  local_48 = (ulong)ctx->depth_;
  msg_00 = (MessageLite *)(local_48 - 1);
  ctx->depth_ = (int)msg_00;
  if ((long)local_48 < 1) {
    return (char *)0x0;
  }
  local_58[0] = (ushort *)(ptr + 2);
  iVar11 = ctx->group_depth_;
  iVar4 = (int)((long)iVar11 + 1);
  ctx->group_depth_ = iVar4;
  while (bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                           (&ctx->super_EpsCopyInputStream,(char **)local_58,ctx->group_depth_),
        !bVar3) {
    uVar5 = (uint)pTVar6->fast_idx_mask & (uint)*local_58[0];
    if ((uVar5 & 7) != 0) {
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
    uVar8 = (ulong)(uVar5 & 0xfffffff8);
    local_58[0] = (ushort *)
                  (**(code **)(&pTVar6[1].has_bits_offset + uVar8))
                            (pMVar7,local_58[0],ctx,
                             (ulong)*local_58[0] ^ *(ulong *)(&pTVar6[1].fast_idx_mask + uVar8 * 2),
                             pTVar6,0);
    if ((local_58[0] == (ushort *)0x0) || ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0))
    break;
  }
  if ((pTVar6->field_0x9 & 1) == 0) {
    puVar10 = local_58[0];
    if (local_58[0] == (ushort *)0x0) {
      VerifyHasBitConsistency(msg_00,unaff_R13);
      puVar10 = local_58[0];
      goto LAB_0020dadd;
    }
  }
  else {
    puVar10 = (ushort *)(*pTVar6->post_loop_handler)(pMVar7,(char *)local_58[0],ctx);
LAB_0020dadd:
    if (puVar10 == (ushort *)0x0) {
      iVar11 = ctx->group_depth_ + -1;
      local_48 = (ulong)(ctx->depth_ + 1);
      puVar10 = (ushort *)0x0;
      goto LAB_0020da3b;
    }
  }
  if ((int)msg_00 == ctx->depth_) {
    if (iVar4 == ctx->group_depth_) {
LAB_0020da3b:
      ctx->group_depth_ = iVar11;
      ctx->depth_ = (int)local_48;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      puVar12 = (ushort *)0x0;
      if (uVar2 == (int)(char)uVar1 + (uint)uVar1 >> 1) {
        puVar12 = puVar10;
      }
      return (char *)puVar12;
    }
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)iVar11 + 1,(long)ctx->group_depth_,
                             "old_group_depth == group_depth_");
    iVar11 = 0x492;
  }
  else {
    failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                            ((long)msg_00,(long)ctx->depth_,"old_depth == depth_");
    iVar11 = 0x491;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
             ,iVar11,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_58);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGdS2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint16_t, true, false>(
      PROTOBUF_TC_PARAM_PASS);
}